

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::ProcessNoImplicitCallUses(BackwardPass *this,Instr *instr)

{
  undefined1 *puVar1;
  OpCode OVar2;
  uint uVar3;
  ArrayRegOpnd *pAVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  undefined4 *puVar10;
  BackwardPass *this_00;
  Func *pFVar11;
  Func *pFVar12;
  StackSym *stackSym;
  Instr *this_01;
  Opnd *this_02;
  ArrayRegOpnd *arrayRegOpnd;
  ArrayRegOpnd *this_03;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  this_01 = instr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    this_01 = (Instr *)0x1134;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1134,"(instr)","instr");
    if (!bVar7) goto LAB_003dcec9;
    *puVar10 = 0;
  }
  OVar2 = instr->m_opcode;
  if (OVar2 == NoImplicitCallUses) {
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      this_01 = (Instr *)0x113a;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar7) goto LAB_003dcec9;
      *puVar10 = 0;
    }
    if (instr->m_dst != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      this_01 = (Instr *)0x113b;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113b,"(!instr->GetDst())","!instr->GetDst()");
      if (!bVar7) goto LAB_003dcec9;
      *puVar10 = 0;
    }
    this_02 = instr->m_src1;
    if (this_02 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      this_01 = (Instr *)0x113c;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113c,"(instr->GetSrc1())","instr->GetSrc1()");
      if (!bVar7) goto LAB_003dcec9;
      *puVar10 = 0;
      this_02 = instr->m_src1;
    }
    OVar8 = IR::Opnd::GetKind(this_02);
    if ((OVar8 != OpndKindReg) && (OVar8 = IR::Opnd::GetKind(instr->m_src1), OVar8 != OpndKindSym))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      this_01 = (Instr *)0x113d;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113d,"(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd())",
                         "instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd()");
      if (!bVar7) goto LAB_003dcec9;
      *puVar10 = 0;
    }
    if (((instr->m_src2 != (Opnd *)0x0) &&
        (OVar8 = IR::Opnd::GetKind(instr->m_src2), OVar8 != OpndKindReg)) &&
       (OVar8 = IR::Opnd::GetKind(instr->m_src2), OVar8 != OpndKindSym)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      this_01 = (Instr *)0x113e;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113e,
                         "(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd())"
                         ,
                         "!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd()"
                        );
      if (!bVar7) {
LAB_003dcec9:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar10 = 0;
    }
    if (this->isCollectionPass == false) {
      this_00 = (BackwardPass *)__tls_get_addr(&PTR_01548f08);
      pAVar4 = (ArrayRegOpnd *)instr->m_src2;
      this_03 = (ArrayRegOpnd *)instr->m_src1;
      bVar7 = true;
      do {
        bVar6 = bVar7;
        if (this_03 == (ArrayRegOpnd *)0x0) break;
        OVar8 = IR::Opnd::GetKind((Opnd *)this_03);
        if (OVar8 == OpndKindSym) {
          OVar8 = IR::Opnd::GetKind((Opnd *)this_03);
          if (OVar8 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&this_00->func = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar7) goto LAB_003dcec9;
            *(undefined4 *)&this_00->func = 0;
          }
          stackSym = (this_03->super_RegOpnd).m_sym;
          if ((stackSym->super_Sym).m_kind == SymKindProperty) {
LAB_003dcd61:
            arrayRegOpnd = (ArrayRegOpnd *)0x0;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&this_00->func = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x115e,"(sym->IsPropertySym())","sym->IsPropertySym()");
            if (!bVar7) goto LAB_003dcec9;
            arrayRegOpnd = (ArrayRegOpnd *)0x0;
LAB_003dcde9:
            *(undefined4 *)&this_00->func = 0;
          }
        }
        else {
          if (OVar8 != OpndKindReg) {
            ProcessNoImplicitCallUses(this_00);
            if (this_00->tag != DeadStorePhase) {
              return false;
            }
            if (this_00->currentPrePassLoop != (Loop *)0x0) {
              return false;
            }
            if ((((this_01->field_0x38 & 0x10) == 0) &&
                (bVar7 = OpCodeAttr::CallInstr(this_01->m_opcode), !bVar7)) &&
               ((bVar7 = IR::Instr::CallsAccessor(this_01,(PropertySymOpnd *)0x0), !bVar7 &&
                ((bVar7 = GlobOpt::MayNeedBailOnImplicitCall(this_01,(Value *)0x0,(Value *)0x0),
                 !bVar7 && (bVar7 = IR::Instr::HasAnyLoadHeapArgsOpCode(this_01), !bVar7)))))) {
              if (this_01->m_opcode == InlineeStart) {
                if (this_01->m_src1 != (Opnd *)0x0) {
                  bVar7 = ProcessInlineeStart(this_00,this_01);
                  return bVar7;
                }
                if ((this_01->m_func->field_0x240 & 2) != 0) {
                  return false;
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar10 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x1fec,"(instr->m_func->m_hasInlineArgsOpt)",
                                   "instr->m_func->m_hasInlineArgsOpt");
                if (bVar7) {
                  *puVar10 = 0;
                  return false;
                }
                goto LAB_003dd067;
              }
              if (this_01->m_opcode != LdFuncExpr) {
                return false;
              }
            }
            if (this_01->m_opcode == InlineeStart) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1fe3,"(instr->m_opcode != Js::OpCode::InlineeStart)",
                                 "instr->m_opcode != Js::OpCode::InlineeStart");
              if (!bVar7) {
LAB_003dd067:
                pcVar5 = (code *)invalidInstructionException();
                (*pcVar5)();
              }
              *puVar10 = 0;
            }
            pFVar11 = this_01->m_func;
            puVar1 = &pFVar11->field_0x240;
            *(uint *)puVar1 = *(uint *)puVar1 | 0x8000;
            pFVar11 = pFVar11->parentFunc;
            if (pFVar11 != (Func *)0x0) {
              for (pFVar12 = pFVar11->parentFunc; pFVar12 != (Func *)0x0;
                  pFVar12 = pFVar12->parentFunc) {
                pFVar11->field_0x241 = pFVar11->field_0x241 | 0x80;
                pFVar11 = pFVar12;
              }
            }
            return false;
          }
          OVar8 = IR::Opnd::GetKind((Opnd *)this_03);
          if (OVar8 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&this_00->func = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar7) goto LAB_003dcec9;
            *(undefined4 *)&this_00->func = 0;
          }
          stackSym = (this_03->super_RegOpnd).m_sym;
          BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (this->considerSymsAsRealUsesInNoImplicitCallUses,
                             (stackSym->super_Sym).m_id);
          if (BVar9 != '\0') {
            if ((stackSym->super_Sym).m_kind != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&this_00->func = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
              if (!bVar7) goto LAB_003dcec9;
              *(undefined4 *)&this_00->func = 0;
            }
            ProcessStackSymUse(this,stackSym,'\x01');
          }
          bVar7 = IR::RegOpnd::IsArrayRegOpnd(&this_03->super_RegOpnd);
          if (!bVar7) goto LAB_003dcd61;
          bVar7 = IR::RegOpnd::IsArrayRegOpnd(&this_03->super_RegOpnd);
          arrayRegOpnd = this_03;
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&this_00->func = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
            if (bVar7) goto LAB_003dcde9;
            goto LAB_003dcec9;
          }
        }
        uVar3 = (stackSym->super_Sym).m_id;
        this_01 = (Instr *)(ulong)uVar3;
        BVSparse<Memory::JitArenaAllocator>::Set(this->currentBlock->noImplicitCallUses,uVar3);
        local_32[0] = (this_03->super_RegOpnd).super_Opnd.m_valueType.field_0;
        bVar7 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
        if (bVar7) {
          bVar7 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
          if (bVar7) {
            uVar3 = (stackSym->super_Sym).m_id;
            this_01 = (Instr *)(ulong)uVar3;
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNoMissingValuesUses,uVar3);
          }
          bVar7 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0);
          if (!bVar7) {
            uVar3 = (stackSym->super_Sym).m_id;
            this_01 = (Instr *)(ulong)uVar3;
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNativeArrayUses,uVar3);
          }
          if (arrayRegOpnd != (ArrayRegOpnd *)0x0) {
            this_01 = instr;
            ProcessArrayRegOpndUse(this,instr,arrayRegOpnd);
          }
        }
        this_03 = pAVar4;
        bVar7 = false;
      } while (bVar6);
      if (this->currentPrePassLoop == (Loop *)0x0) {
        BasicBlock::RemoveInstr(this->currentBlock,instr);
      }
    }
  }
  return OVar2 == NoImplicitCallUses;
}

Assistant:

bool
BackwardPass::ProcessNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(instr);

    if(instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        return false;
    }
    Assert(tag == Js::DeadStorePhase);
    Assert(!instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd());
    Assert(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd());

    if(IsCollectionPass())
    {
        return true;
    }

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]) && srcs[i]; ++i)
    {
        IR::Opnd *const src = srcs[i];
        IR::ArrayRegOpnd *arraySrc = nullptr;
        Sym *sym = nullptr;
        switch(src->GetKind())
        {
            case IR::OpndKindReg:
            {
                IR::RegOpnd *const regSrc = src->AsRegOpnd();
                sym = regSrc->m_sym;
                if(considerSymsAsRealUsesInNoImplicitCallUses->TestAndClear(sym->m_id))
                {
                    ProcessStackSymUse(sym->AsStackSym(), true);
                }
                if(regSrc->IsArrayRegOpnd())
                {
                    arraySrc = regSrc->AsArrayRegOpnd();
                }
                break;
            }

            case IR::OpndKindSym:
                sym = src->AsSymOpnd()->m_sym;
                Assert(sym->IsPropertySym());
                break;

            default:
                Assert(false);
                __assume(false);
        }

        currentBlock->noImplicitCallUses->Set(sym->m_id);
        const ValueType valueType(src->GetValueType());
        if(valueType.IsArrayOrObjectWithArray())
        {
            if(valueType.HasNoMissingValues())
            {
                currentBlock->noImplicitCallNoMissingValuesUses->Set(sym->m_id);
            }
            if(!valueType.HasVarElements())
            {
                currentBlock->noImplicitCallNativeArrayUses->Set(sym->m_id);
            }
            if(arraySrc)
            {
                ProcessArrayRegOpndUse(instr, arraySrc);
            }
        }
    }

    if(!IsPrePass())
    {
        currentBlock->RemoveInstr(instr);
    }
    return true;
}